

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

int __thiscall CDefineTable::Remove(CDefineTable *this,char *name)

{
  int iVar1;
  CDefineTableEntry *local_30;
  CDefineTableEntry *p2;
  CDefineTableEntry *p;
  char *name_local;
  CDefineTable *this_local;
  
  p2 = this->defs[(int)((int)*name & 0x7f)];
  local_30 = (CDefineTableEntry *)0x0;
  while( true ) {
    if (p2 == (CDefineTableEntry *)0x0) {
      return 0;
    }
    iVar1 = strcmp(name,p2->name);
    if (iVar1 == 0) break;
    local_30 = p2;
    p2 = p2->next;
  }
  if (local_30 == (CDefineTableEntry *)0x0) {
    this->defs[(int)((int)*name & 0x7f)] = p2->next;
  }
  else {
    local_30->next = p2->next;
  }
  p2->next = (CDefineTableEntry *)0x0;
  if (p2 != (CDefineTableEntry *)0x0) {
    CDefineTableEntry::~CDefineTableEntry(p2);
    operator_delete(p2,0x20);
  }
  this->DefArrayList = (CStringsList *)0x0;
  return 1;
}

Assistant:

int CDefineTable::Remove(const char* name) {
	CDefineTableEntry* p = defs[(*name)&127];
	CDefineTableEntry* p2 = NULL;
	while (p) {
		if (!strcmp(name, p->name)) {
			// unchain the particular item
			if (NULL == p2) defs[(*name)&127] = p->next;
			else			p2->next = p->next;
			p->next = NULL;
			// delete it
			delete p;
			DefArrayList = NULL;		// may be invalid here, so just reset it
			return 1;
		}
		p2 = p;
		p = p->next;
	}
	return 0;
}